

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrands.cpp
# Opt level: O0

void __thiscall getRands::getRands(getRands *this,rd_option rndopt,int rand_vec_size,int rand_seed)

{
  rd_option rVar1;
  result_type __sd;
  value_type_conflict local_30 [5];
  int local_1c;
  int local_18;
  int rand_seed_local;
  int rand_vec_size_local;
  rd_option rndopt_local;
  getRands *this_local;
  
  this->buf_ = (OASIS_FLOAT *)0x0;
  local_1c = rand_seed;
  local_18 = rand_vec_size;
  rand_seed_local = rndopt;
  _rand_vec_size_local = this;
  __sd = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->gen_,__sd);
  std::uniform_real_distribution<double>::uniform_real_distribution(&this->dis_,0.0,1.0);
  this->rand_vec_size_ = local_18;
  this->rand_seed_ = local_1c;
  std::vector<float,_std::allocator<float>_>::vector(&this->rnd_);
  if (0 < this->rand_seed_) {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&this->gen_,(long)this->rand_seed_);
  }
  this->rndopt_ = rand_seed_local;
  this->base_offset_ = 0;
  rVar1 = this->rndopt_;
  if (rVar1 == userandomnumberfile) {
    userandfile(this);
  }
  else if (rVar1 != usehashedseed) {
    if (rVar1 != usecachedvector) {
      fprintf(_stderr,"FATAL: %s: Unknow random number option\n","getRands");
      exit(-1);
    }
    local_30[0] = -1.0;
    std::vector<float,_std::allocator<float>_>::resize(&this->rnd_,(long)local_18,local_30);
  }
  return;
}

Assistant:

getRands::getRands(rd_option rndopt, int rand_vec_size,int rand_seed) : gen_(time(0)), dis_(0, 1), rand_vec_size_(rand_vec_size), rand_seed_(rand_seed)
{
	if (rand_seed_ > 0) gen_.seed(rand_seed_);

	rndopt_ = rndopt;

	base_offset_ = 0;
	switch (rndopt_) {
		case rd_option::userandomnumberfile:
			userandfile();
		break;
		case rd_option::usecachedvector:
			rnd_.resize(rand_vec_size, -1);
		break;
		case rd_option::usehashedseed:
			// nothing to do
			break;
		default:
			fprintf(stderr, "FATAL: %s: Unknow random number option\n", __func__);
			exit(-1);
	}
	
}